

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_alloc_info(small_alloc *alloc,void *ptr,size_t size,small_alloc_info *info)

{
  small_mempool *psVar1;
  small_mempool *small_mempool;
  small_alloc_info *info_local;
  size_t size_local;
  void *ptr_local;
  small_alloc *alloc_local;
  
  psVar1 = small_mempool_search(alloc,size);
  info->is_large = psVar1 == (small_mempool *)0x0;
  if ((info->is_large & 1U) == 0) {
    info->real_size = (ulong)(psVar1->used_pool->pool).objsize;
  }
  else {
    info->real_size = size;
  }
  if (size <= info->real_size) {
    return;
  }
  __assert_fail("info->real_size >= size",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x1de,
                "void small_alloc_info(struct small_alloc *, void *, size_t, struct small_alloc_info *)"
               );
}

Assistant:

void
small_alloc_info(struct small_alloc *alloc, void *ptr, size_t size,
		 struct small_alloc_info *info)
{
	(void)ptr;
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	info->is_large = small_mempool == NULL;
	if (info->is_large)
		info->real_size = size;
	else
		info->real_size = small_mempool->used_pool->pool.objsize;
	assert(info->real_size >= size);
}